

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ShaderSubroutine::APITest1::iterate(APITest1 *this)

{
  ostringstream *this_00;
  ostringstream *poVar1;
  ostringstream *this_01;
  undefined4 uVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  long lVar7;
  NotSupportedError *this_02;
  char *description;
  float fVar8;
  double dVar9;
  float fVar10;
  double dVar11;
  GLboolean bool_value;
  GLint int_value;
  GLfloat float_value;
  char *local_1e8;
  GLdouble double_value;
  int local_1d4;
  GLint64 int64_value;
  APITest1 *local_1c8;
  long local_1c0;
  long local_1b8;
  undefined1 local_1b0 [384];
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1c0 = CONCAT44(extraout_var,iVar5);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar4) {
    this_00 = (ostringstream *)(local_1b0 + 8);
    lVar7 = 0x10;
    local_1c8 = this;
    while (lVar3 = local_1c0, lVar7 != 0x40) {
      double_value = 0.0;
      float_value = 0.0;
      int_value = 0;
      int64_value = 0;
      bool_value = '\0';
      local_1d4 = *(int *)((long)&DAT_01dca350 + lVar7);
      local_1e8 = *(char **)(&UNK_01dca348 + lVar7);
      uVar2 = *(undefined4 *)((long)&PTR_iterate_01dca340 + lVar7);
      local_1b8 = lVar7;
      (**(code **)(local_1c0 + 0x798))(uVar2,&bool_value);
      dVar6 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar6,"glGetBooleanv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6b9);
      (**(code **)(lVar3 + 0x7f8))(uVar2,&double_value);
      dVar6 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar6,"glGetDoublev() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6bc);
      (**(code **)(lVar3 + 0x818))(uVar2,&float_value);
      dVar6 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar6,"glGetFloatv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6bf);
      (**(code **)(lVar3 + 0x868))(uVar2,&int_value);
      dVar6 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar6,"glGetIntegerv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6c2);
      this = local_1c8;
      (**(code **)(lVar3 + 0x850))(uVar2,&int64_value);
      dVar6 = (**(code **)(lVar3 + 0x800))();
      iVar5 = local_1d4;
      glu::checkError(dVar6,"glGetInteger64v() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6c5);
      if (int_value < iVar5) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"GL implementation reports a value of [");
        std::ostream::operator<<(this_00,int_value);
        std::operator<<((ostream *)this_00,"] for property [");
        std::operator<<((ostream *)this_00,local_1e8);
        std::operator<<((ostream *)this_00,"], whereas the min max for the property is [");
        std::ostream::operator<<(this_00,iVar5);
        std::operator<<((ostream *)this_00,"].");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        this->m_has_test_passed = false;
      }
      poVar1 = (ostringstream *)(local_1b0 + 8);
      this_01 = (ostringstream *)(local_1b0 + 8);
      if ((int_value == 0 && bool_value == '\x01') || (bool_value != '\x01' && int_value != 0)) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Invalid boolean value [");
        std::operator<<((ostream *)poVar1,bool_value);
        std::operator<<((ostream *)poVar1,"] reported for property [");
        std::operator<<((ostream *)poVar1,local_1e8);
        std::operator<<((ostream *)poVar1,"] (int value:[");
        std::ostream::operator<<(poVar1,int_value);
        std::operator<<((ostream *)poVar1,"])");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        this->m_has_test_passed = false;
      }
      dVar9 = double_value - (double)int_value;
      dVar11 = -dVar9;
      if (-dVar9 <= dVar9) {
        dVar11 = dVar9;
      }
      if (9.999999747378752e-06 < dVar11) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::operator<<((ostream *)this_01,"Invalid double value [");
        std::ostream::_M_insert<double>(double_value);
        std::operator<<((ostream *)this_01,"] reported for property [");
        std::operator<<((ostream *)this_01,local_1e8);
        std::operator<<((ostream *)this_01,"] (int value:[");
        std::ostream::operator<<(this_01,int_value);
        std::operator<<((ostream *)this_01,"])");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_01);
        this->m_has_test_passed = false;
      }
      fVar10 = float_value - (float)int_value;
      fVar8 = -fVar10;
      if (-fVar10 <= fVar10) {
        fVar8 = fVar10;
      }
      poVar1 = (ostringstream *)(local_1b0 + 8);
      if (1e-05 < fVar8) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Invalid float value [");
        std::ostream::operator<<(poVar1,float_value);
        std::operator<<((ostream *)poVar1,"] reported for property [");
        std::operator<<((ostream *)poVar1,local_1e8);
        std::operator<<((ostream *)poVar1,"] (int value:[");
        std::ostream::operator<<(poVar1,int_value);
        std::operator<<((ostream *)poVar1,"])");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        this->m_has_test_passed = false;
      }
      poVar1 = (ostringstream *)(local_1b0 + 8);
      if (int64_value != int_value) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Invalid 64-bit integer value [");
        std::ostream::operator<<(poVar1,float_value);
        std::operator<<((ostream *)poVar1,"] reported for property [");
        std::operator<<((ostream *)poVar1,local_1e8);
        std::operator<<((ostream *)poVar1,"] (int value:[");
        std::ostream::operator<<(poVar1,int_value);
        std::operator<<((ostream *)poVar1,"])");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        this->m_has_test_passed = false;
      }
      lVar7 = local_1b8 + 0x18;
    }
    bVar4 = this->m_has_test_passed == false;
    if (bVar4) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar4,
               description);
    return STOP;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"GL_ARB_shader_subroutine is not supported.",
             (allocator<char> *)&double_value);
  tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1b0);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult APITest1::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Iterate over all pnames */
	const struct
	{
		glw::GLenum pname;
		const char* pname_string;
		glw::GLint  min_value;
	} pnames[] = { { GL_MAX_SUBROUTINES, "GL_MAX_SUBROUTINES", 256 },
				   { GL_MAX_SUBROUTINE_UNIFORM_LOCATIONS, "GL_MAX_SUBROUTINE_UNIFORM_LOCATIONS", 1024 } };
	const unsigned int n_pnames = sizeof(pnames) / sizeof(pnames[0]);

	for (unsigned int n_pname = 0; n_pname < n_pnames; ++n_pname)
	{
		glw::GLboolean	 bool_value   = GL_FALSE;
		glw::GLdouble	  double_value = 0.0;
		glw::GLfloat	   float_value  = 0.0f;
		glw::GLint		   int_value	= 0;
		glw::GLint64	   int64_value  = 0;
		const glw::GLint   min_value	= pnames[n_pname].min_value;
		const glw::GLenum& pname		= pnames[n_pname].pname;
		const char*		   pname_string = pnames[n_pname].pname_string;

		/* Retrieve the pname values */
		gl.getBooleanv(pname, &bool_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() call failed.");

		gl.getDoublev(pname, &double_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetDoublev() call failed.");

		gl.getFloatv(pname, &float_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() call failed.");

		gl.getIntegerv(pname, &int_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed.");

		gl.getInteger64v(pname, &int64_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInteger64v() call failed.");

		/* Make sure the value reported meets the min max requirement */
		if (int_value < min_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "GL implementation reports a value of [" << int_value
							   << "]"
								  " for property ["
							   << pname_string << "]"
												  ", whereas the min max for the property is ["
							   << min_value << "]." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		/* Verify the other getters reported valid values */
		const float epsilon = 1e-5f;

		if (((int_value == 0) && (bool_value == GL_TRUE)) || ((int_value != 0) && (bool_value != GL_TRUE)))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid boolean value [" << bool_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		if (de::abs(double_value - (double)int_value) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid double value [" << double_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		if (de::abs(float_value - (float)int_value) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid float value [" << float_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		if (int64_value != int_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid 64-bit integer value [" << float_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	} /* for (all pnames) */

	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}